

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QList<QGestureRecognizer_*> * __thiscall
QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::values
          (QMultiMap<Qt::GestureType,_QGestureRecognizer_*> *this,GestureType *key)

{
  long lVar1;
  back_insert_iterator<QList<QGestureRecognizer_*>_> __result;
  const_iterator in_RDX;
  const_iterator in_RSI;
  _Base_ptr in_RDI;
  long in_FS_OFFSET;
  pair<QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::const_iterator,_QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::const_iterator>
  pVar2;
  QList<QGestureRecognizer_*> *result;
  pair<QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::const_iterator,_QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::const_iterator>
  range;
  const_iterator __last;
  const_iterator in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->_M_parent = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->_M_left = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  __last._M_node = in_RDI;
  QList<QGestureRecognizer_*>::QList((QList<QGestureRecognizer_*> *)0x30bd5c);
  pVar2 = equal_range((QMultiMap<Qt::GestureType,_QGestureRecognizer_*> *)
                      in_stack_ffffffffffffff98._M_node,&(__last._M_node)->_M_color);
  std::distance<QMultiMap<Qt::GestureType,QGestureRecognizer*>::const_iterator>
            ((const_iterator)in_stack_ffffffffffffff98._M_node,(const_iterator)__last._M_node);
  QList<QGestureRecognizer_*>::reserve
            ((QList<QGestureRecognizer_*> *)CONCAT17(uVar3,in_stack_ffffffffffffffa8),
             (qsizetype)pVar2.first.i._M_node.i);
  std::back_inserter<QList<QGestureRecognizer*>>((QList<QGestureRecognizer_*> *)in_RDI);
  __result.container._7_1_ = uVar3;
  __result.container._0_7_ = in_stack_ffffffffffffffa8;
  std::
  copy<QMultiMap<Qt::GestureType,QGestureRecognizer*>::const_iterator,std::back_insert_iterator<QList<QGestureRecognizer*>>>
            ((const_iterator)in_RSI._M_node,(const_iterator)in_RDX._M_node,__result);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QGestureRecognizer_*> *)in_RDI;
}

Assistant:

QList<T> values(const Key &key) const
    {
        QList<T> result;
        const auto range = equal_range(key);
        result.reserve(std::distance(range.first, range.second));
        std::copy(range.first, range.second, std::back_inserter(result));
        return result;
    }